

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.h
# Opt level: O3

void Js::CompoundString::AppendGeneric<4u,Js::CompoundString>
               (char16 (*s) [4],bool isCppLiteral,CompoundString *toString,bool appendChars)

{
  JavascriptLibrary *pJVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  char16 *pcVar5;
  StaticType *type;
  JavascriptString *s_00;
  char16_t *pcVar6;
  
  if ((*s)[3] != L'\0') {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x476,"(s[AppendCharLengthPlusOne - 1] == u\'\\0\')",
                                "s[AppendCharLengthPlusOne - 1] == _u(\'\\0\')");
    if (!bVar3) goto LAB_00b3f8ee;
    *puVar4 = 0;
  }
  if (toString == (CompoundString *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x477,"(toString)","toString");
    if (!bVar3) goto LAB_00b3f8ee;
    *puVar4 = 0;
  }
  pcVar5 = JavascriptString::UnsafeGetBuffer((JavascriptString *)toString);
  if (pcVar5 != (char16 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x478,"(!toString->IsFinalized())","!toString->IsFinalized()");
    if (!bVar3) goto LAB_00b3f8ee;
    *puVar4 = 0;
  }
  bVar3 = OwnsLastBlock(toString);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x479,"(toString->OwnsLastBlock())","toString->OwnsLastBlock()");
    if (!bVar3) goto LAB_00b3f8ee;
    *puVar4 = 0;
  }
  if (appendChars) {
    bVar3 = HasOnlyDirectChars(toString);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                  ,0x47a,"(!(appendChars && !toString->HasOnlyDirectChars()))",
                                  "!(appendChars && !toString->HasOnlyDirectChars())");
      if (!bVar3) {
LAB_00b3f8ee:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
    }
  }
  if (!isCppLiteral) {
    AppendGeneric<Js::CompoundString>(*s,3,toString,appendChars);
    return;
  }
  bVar3 = Phases::IsEnabled((Phases *)&DAT_015b6718,StringConcatPhase);
  if (bVar3) {
    pcVar6 = L"false";
    if (appendChars) {
      pcVar6 = L"true";
    }
    Output::Print(L"CompoundString::AppendGeneric(C++ literal \"%.8s%s\", appendCharLength = %u, appendChars = %s)\n"
                  ,s,L"",3,pcVar6);
    Output::Flush();
  }
  if (appendChars) {
    bVar3 = TryAppendGeneric<Js::CompoundString>(*s,3,toString);
LAB_00b3f803:
    if (bVar3 == false) {
      AppendSlow(toString,*s,3);
      return;
    }
  }
  else {
    bVar3 = HasOnlyDirectChars(toString);
    if (bVar3) {
      bVar3 = Block::ShouldAppendChars(3,0x20);
      if (bVar3) {
        bVar3 = TryAppendFewCharsGeneric<Js::CompoundString>(*s,3,toString);
        goto LAB_00b3f803;
      }
      SwitchToPointerMode(toString);
    }
    pJVar1 = (((toString->super_LiteralString).super_JavascriptString.super_RecyclableObject.type.
              ptr)->javascriptLibrary).ptr;
    type = StringCache::GetStringTypeStatic(&pJVar1->stringCache);
    s_00 = &LiteralString::New(type,*s,3,pJVar1->recycler)->super_JavascriptString;
    bVar3 = TryAppendGeneric<Js::CompoundString>(s_00,3,toString);
    if (!bVar3) {
      AppendSlow(toString,s_00);
      return;
    }
  }
  return;
}

Assistant:

inline void CompoundString::AppendGeneric(
        const char16 (&s)[AppendCharLengthPlusOne],
        const bool isCppLiteral,
        String *const toString,
        const bool appendChars)
    {
        CompileAssert(AppendCharLengthPlusOne != 0);
        Assert(s);
        Assert(s[AppendCharLengthPlusOne - 1] == _u('\0'));
        Assert(toString);
        Assert(!toString->IsFinalized());
        Assert(toString->OwnsLastBlock());
        Assert(!(appendChars && !toString->HasOnlyDirectChars()));

        if(AppendCharLengthPlusOne == 1)
            return;
        if(AppendCharLengthPlusOne == 2)
        {
            AppendGeneric(s[0], toString, appendChars);
            return;
        }

        const CharCount appendCharLength = AppendCharLengthPlusOne - 1;
        if(!isCppLiteral)
        {
            AppendGeneric(s, appendCharLength, toString, appendChars);
            return;
        }

        if(PHASE_TRACE_StringConcat)
        {
            Output::Print(
                _u("CompoundString::AppendGeneric(C++ literal \"%.8s%s\", appendCharLength = %u, appendChars = %s)\n"),
                s,
                appendCharLength > 8 ? _u("...") : _u(""),
                appendCharLength,
                appendChars ? _u("true") : _u("false"));
            Output::Flush();
        }

        if(appendChars || toString->HasOnlyDirectChars())
        {
            if(appendChars || Block::ShouldAppendChars(appendCharLength, sizeof(LiteralString)))
            {
                if(appendChars
                        ? TryAppendGeneric(s, appendCharLength, toString)
                        : TryAppendFewCharsGeneric(s, appendCharLength, toString))
                {
                    return;
                }
                toString->AppendSlow(s, appendCharLength);
                return;
            }

            toString->SwitchToPointerMode();
        }

        JavascriptString *const js = toString->GetLibrary()->CreateStringFromCppLiteral(s);
        if(TryAppendGeneric(js, appendCharLength, toString))
            return;
        toString->AppendSlow(js);
    }